

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

RegexFlags __thiscall
Js::JavascriptRegExp::SetRegexFlag
          (JavascriptRegExp *this,PropertyId propertyId,RegexFlags flags,RegexFlags flag,
          ScriptContext *scriptContext)

{
  RegexFlags RVar1;
  BOOL BVar2;
  Var aValue;
  
  aValue = JavascriptOperators::GetProperty
                     ((RecyclableObject *)this,propertyId,scriptContext,(PropertyValueInfo *)0x0);
  BVar2 = JavascriptConversion::ToBoolean(aValue,scriptContext);
  RVar1 = ~flag & flags;
  if (BVar2 != 0) {
    RVar1 = flag | flags;
  }
  return RVar1;
}

Assistant:

UnifiedRegex::RegexFlags JavascriptRegExp::SetRegexFlag(
        PropertyId propertyId,
        UnifiedRegex::RegexFlags flags,
        UnifiedRegex::RegexFlags flag,
        ScriptContext* scriptContext)
    {
        bool isEnabled = JavascriptConversion::ToBool(
            JavascriptOperators::GetProperty(this, propertyId, scriptContext),
            scriptContext);
        return isEnabled
            ? static_cast<UnifiedRegex::RegexFlags>(flags | flag)
            : static_cast<UnifiedRegex::RegexFlags>(flags & ~flag);
    }